

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

bool __thiscall TGAImage::read_tga_file(TGAImage *this,string *filename)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  allocator_type local_25a;
  value_type_conflict2 local_259;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined2 local_248;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  ifstream in;
  int aiStack_200 [122];
  
  std::ifstream::ifstream((string *)&in);
  std::ifstream::open((string *)&in,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar5 = std::operator<<((ostream *)&std::cerr,"can\'t open file ");
    poVar5 = std::operator<<(poVar5,(string *)filename);
    std::operator<<(poVar5,"\n");
    std::ifstream::close();
  }
  else {
    local_258 = 0;
    uStack_250 = 0;
    local_248 = 0;
    std::istream::read((char *)&in,(long)&local_258);
    if (*(int *)((long)aiStack_200 + *(long *)(_in + -0x18)) == 0) {
      this->width = (uint)uStack_250._4_2_;
      this->height = (uint)uStack_250._6_2_;
      uVar3 = (uint)((byte)local_248 >> 3);
      this->bytespp = uVar3;
      if (((uStack_250._6_2_ != 0 && uStack_250._4_2_ != 0) && ((byte)local_248 >> 3 < 5)) &&
         ((0x1aU >> uVar3 & 1) != 0)) {
        local_259 = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
                   (ulong)((uint)uStack_250._6_2_ * (uint)uStack_250._4_2_ * uVar3),&local_259,
                   &local_25a);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&this->data,&local_238);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_238);
        if ((local_258._2_1_ & 0xfe) == 10) {
          bVar2 = load_rle_data(this,&in);
          if (bVar2) {
LAB_00104333:
            if ((local_248 & 0x2000) == 0) {
              flip_vertically(this);
            }
            if ((local_248._1_1_ & 0x10) != 0) {
              flip_horizontally(this);
            }
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            poVar5 = std::operator<<(poVar5,"x");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5,"/");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5,"\n");
            bVar2 = true;
            std::ifstream::close();
            goto LAB_0010426c;
          }
LAB_00104305:
          std::ifstream::close();
          pcVar4 = "an error occurred while reading the data\n";
          poVar5 = (ostream *)&std::cerr;
        }
        else {
          if ((local_258._2_1_ & 0xfe) == 2) {
            std::istream::read((char *)&in,
                               (long)(this->data).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            if (*(int *)((long)aiStack_200 + *(long *)(_in + -0x18)) == 0) goto LAB_00104333;
            goto LAB_00104305;
          }
          std::ifstream::close();
          poVar5 = std::operator<<((ostream *)&std::cerr,"unknown file format ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          pcVar4 = "\n";
        }
        std::operator<<(poVar5,pcVar4);
        goto LAB_0010426a;
      }
      std::ifstream::close();
      pcVar4 = "bad bpp (or width/height) value\n";
    }
    else {
      std::ifstream::close();
      pcVar4 = "an error occurred while reading the header\n";
    }
    std::operator<<((ostream *)&std::cerr,pcVar4);
  }
LAB_0010426a:
  bVar2 = false;
LAB_0010426c:
  std::ifstream::~ifstream(&in);
  return bVar2;
}

Assistant:

bool TGAImage::read_tga_file(const std::string filename)
{
    std::ifstream in;
    in.open(filename, std::ios::binary);
    if (!in.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        in.close();
        return false;
    }
    TGA_Header header{};
    in.read(reinterpret_cast<char *>(&header), sizeof(header));
    if (!in.good()) {
        in.close();
        std::cerr << "an error occurred while reading the header\n";
        return false;
    }
    width = header.width;
    height = header.height;
    bytespp = header.bitsperpixel >> 3;
    if (width <= 0 || height <= 0 || (bytespp != GRAYSCALE && bytespp != RGB && bytespp != RGBA)) {
        in.close();
        std::cerr << "bad bpp (or width/height) value\n";
        return false;
    }
    size_t nbytes = bytespp * width * height;
    data = std::vector<std::uint8_t>(nbytes, 0);
    if (3 == header.datatypecode || 2 == header.datatypecode) {
        in.read(reinterpret_cast<char *>(data.data()), nbytes);
        if (!in.good()) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else if (10 == header.datatypecode || 11 == header.datatypecode) {
        if (!load_rle_data(in)) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else {
        in.close();
        std::cerr << "unknown file format " << (size_t)header.datatypecode << "\n";
        return false;
    }
    if (!(header.imagedescriptor & 0x20)) flip_vertically();
    if (header.imagedescriptor & 0x10) flip_horizontally();
    std::cerr << width << "x" << height << "/" << bytespp * 8 << "\n";
    in.close();
    return true;
}